

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.cpp
# Opt level: O0

void __thiscall cppcms::filters::to_title::operator()(to_title *this,ostream *out)

{
  locale *loc;
  ios_base *this_00;
  ostream *in_RSI;
  steal_buffer<128UL> *in_RDI;
  steal_buffer<128UL> sb;
  ostream *in_stack_fffffffffffffeb8;
  steal_buffer<128UL> *in_stack_fffffffffffffec0;
  ostream *in_stack_fffffffffffffec8;
  char *in_stack_fffffffffffffed8;
  string local_120 [272];
  ostream *local_10;
  
  local_10 = in_RSI;
  util::steal_buffer<128UL>::steal_buffer(in_RDI,in_stack_fffffffffffffec8);
  streamable::operator()((streamable *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  util::steal_buffer<128UL>::release(in_stack_fffffffffffffec0);
  loc = (locale *)util::stackbuf<128UL>::begin((stackbuf<128UL> *)0x40b5fd);
  this_00 = (ios_base *)util::stackbuf<128UL>::end((stackbuf<128UL> *)0x40b60e);
  std::ios_base::getloc(this_00);
  booster::locale::to_title<char>(in_stack_fffffffffffffed8,(char *)in_RDI,loc);
  std::operator<<(local_10,local_120);
  std::__cxx11::string::~string(local_120);
  std::locale::~locale((locale *)&stack0xfffffffffffffed8);
  util::steal_buffer<128UL>::~steal_buffer(in_RDI);
  return;
}

Assistant:

void to_title::operator()(std::ostream &out) const
	{
		util::steal_buffer<> sb(out);
		obj_(out);
		sb.release();
		out << ::cppcms::locale::to_title( sb.begin(),sb.end(),out.getloc());
	}